

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint flags)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  int *piVar6;
  mz_bool mVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  mz_zip_internal_state *pmVar11;
  int *piVar12;
  ulong uVar13;
  mz_zip_archive *pmVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  mz_zip_archive *pZip_00;
  uint uVar20;
  uint uVar21;
  long lVar22;
  mz_zip_internal_state *pmVar23;
  mz_uint64 mVar24;
  short *psVar25;
  uint uVar26;
  long lVar27;
  bool bVar28;
  mz_uint32 zip64_end_of_central_dir_header_u32 [14];
  mz_uint32 zip64_end_of_central_dir_locator_u32 [5];
  mz_uint32 buf_u32 [1024];
  int local_1098;
  ulong local_1094;
  uint local_1088;
  uint local_1084;
  uint local_1080;
  int local_107c;
  uint local_1078;
  int local_1074;
  uint local_1070;
  int local_106c;
  mz_uint64 local_1068;
  int local_1058 [2];
  ulong local_1050;
  int local_1048;
  int local_1038;
  ushort local_1034;
  ushort local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar19 = pZip->m_archive_size;
  if (uVar19 < 0x16) {
    pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
  }
  else {
    mVar24 = 0;
    if (0x1000 < (long)uVar19) {
      mVar24 = uVar19 - 0x1000;
    }
    uVar15 = 0x1000;
    if (0x1000 < (long)uVar19) {
      uVar15 = uVar19;
    }
    lVar27 = 0x1000 - uVar15;
    lVar22 = 0x1014 - uVar15;
    do {
      uVar15 = uVar19 - mVar24;
      sVar10 = 0x1000;
      if (uVar15 < 0x1000) {
        sVar10 = uVar15;
      }
      sVar8 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar24,&local_1038,sVar10);
      if (sVar8 != sVar10) break;
      if (3 < uVar15) {
        uVar19 = uVar19 + lVar27;
        if (0xfff < uVar19) {
          uVar19 = 0x1000;
        }
        iVar16 = (int)uVar19;
        uVar19 = (ulong)(iVar16 - 4);
        lVar9 = lVar27 - (ulong)(iVar16 - 4);
        iVar16 = iVar16 + -3;
        do {
          if ((*(int *)((long)&local_1038 + uVar19) == 0x6054b50) &&
             (0x15 < pZip->m_archive_size + lVar9)) {
            sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar19 - lVar27,&local_1038,0x16);
            if (sVar10 == 0x16) {
              if (local_1038 != 0x6054b50) {
                pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
                return 0;
              }
              if (((0x4b < (long)(uVar19 - lVar27)) &&
                  (sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar19 - lVar22,local_1058,0x14),
                  sVar10 == 0x14)) && (local_1058[0] == 0x7064b50)) {
                if (pZip->m_archive_size - 0x38 < local_1050) {
                  pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
                  return 0;
                }
                sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_1050,&local_1098,0x38);
                if ((sVar10 == 0x38) && (local_1098 == 0x6064b50)) {
                  pZip->m_pState->m_zip64 = 1;
                }
              }
              pZip->m_total_files = (uint)local_102e;
              pmVar23 = pZip->m_pState;
              if (pmVar23->m_zip64 == 0) {
                local_1080 = (uint)local_1030;
                local_1084 = (uint)local_1032;
                uVar19 = (ulong)local_1028;
                uVar18 = local_102c;
                local_1078 = (uint)local_102e;
                uVar26 = (uint)local_1034;
              }
              else {
                if (local_1094 < 0x2c) goto LAB_0010712a;
                if (local_1048 != 1) goto LAB_0010729e;
                if ((local_1074 != 0) || (pZip->m_total_files = local_1078, local_107c != 0)) {
                  pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
                  return 0;
                }
                uVar19 = local_1068;
                uVar18 = local_1070;
                uVar26 = local_1088;
                if (local_106c != 0) {
                  pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
                  return 0;
                }
              }
              if ((local_1078 != local_1080) ||
                 ((uVar26 != 0 || local_1084 != 0 && (local_1084 != 1 || uVar26 != 1)))) {
LAB_0010729e:
                pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
                return 0;
              }
              if ((uVar18 < local_1078 * 0x2e) ||
                 (uVar15 = (ulong)uVar18, pZip->m_archive_size < uVar19 + uVar15))
              goto LAB_0010712a;
              pZip->m_central_directory_file_ofs = uVar19;
              pZip_00 = (mz_zip_archive *)0x0;
              if (local_1078 == 0) goto LAB_001074d0;
              pmVar11 = pmVar23;
              if ((pmVar23->m_central_dir).m_capacity < uVar15) {
                mVar7 = mz_zip_array_ensure_capacity(pZip,&pmVar23->m_central_dir,uVar15,0);
                if (mVar7 == 0) goto LAB_001072cf;
                pmVar11 = pZip->m_pState;
                local_1078 = pZip->m_total_files;
              }
              (pmVar23->m_central_dir).m_size = uVar15;
              uVar13 = (ulong)local_1078;
              pmVar23 = pmVar11;
              if ((pmVar11->m_central_dir_offsets).m_capacity < uVar13) {
                mVar7 = mz_zip_array_ensure_capacity(pZip,&pmVar11->m_central_dir_offsets,uVar13,0);
                if (mVar7 == 0) {
LAB_001072cf:
                  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                  return 0;
                }
                pmVar23 = pZip->m_pState;
              }
              (pmVar11->m_central_dir_offsets).m_size = uVar13;
              if ((flags >> 0xb & 1) == 0) {
                uVar13 = (ulong)pZip->m_total_files;
                pmVar11 = pmVar23;
                if ((pmVar23->m_sorted_central_dir_offsets).m_capacity < uVar13) {
                  mVar7 = mz_zip_array_ensure_capacity
                                    (pZip,&pmVar23->m_sorted_central_dir_offsets,uVar13,0);
                  if (mVar7 == 0) {
                    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
                    return 0;
                  }
                  pmVar11 = pZip->m_pState;
                }
                (pmVar23->m_sorted_central_dir_offsets).m_size = uVar13;
                pmVar23 = pmVar11;
              }
              sVar10 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar19,(pmVar23->m_central_dir).m_p,
                                        uVar15);
              if (sVar10 == uVar15) {
                pZip_00 = (mz_zip_archive *)0x0;
                if (pZip->m_total_files == 0) goto LAB_001074d0;
                pmVar23 = pZip->m_pState;
                piVar6 = (int *)(pmVar23->m_central_dir).m_p;
                pmVar14 = (mz_zip_archive *)0x0;
                piVar12 = piVar6;
                goto LAB_00107320;
              }
            }
            pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
            return 0;
          }
          uVar19 = uVar19 - 1;
          lVar9 = lVar9 + 1;
          iVar17 = iVar16 + -1;
          bVar28 = 0 < iVar16;
          iVar16 = iVar17;
        } while (iVar17 != 0 && bVar28);
      }
      if (mVar24 == 0) {
        if (pZip == (mz_zip_archive *)0x0) {
          return 0;
        }
        break;
      }
      uVar19 = pZip->m_archive_size;
      uVar15 = uVar19 - mVar24;
      mVar24 = mVar24 - 0xffd;
      lVar27 = lVar27 + 0xffd;
      lVar22 = lVar22 + 0xffd;
    } while (uVar15 < 0x10015);
    pZip->m_last_error = MZ_ZIP_FAILED_FINDING_CENTRAL_DIR;
  }
  return 0;
LAB_00107320:
  if ((uVar18 < 0x2e) || (*piVar12 != 0x2014b50)) {
LAB_0010712a:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  *(int *)((long)(pmVar23->m_central_dir_offsets).m_p + (long)pmVar14 * 4) =
       (int)piVar12 - (int)piVar6;
  if ((flags >> 0xb & 1) == 0) {
    *(int *)((long)(pmVar23->m_sorted_central_dir_offsets).m_p + (long)pmVar14 * 4) = (int)pmVar14;
  }
  uVar20 = piVar12[5];
  uVar5 = piVar12[6];
  uVar2 = *(ushort *)(piVar12 + 7);
  uVar3 = *(ushort *)((long)piVar12 + 0x1e);
  uVar19 = (ulong)uVar3;
  if ((pmVar23->m_zip64_has_extended_info_fields == 0) && (uVar3 != 0)) {
    uVar21 = uVar5;
    if (uVar5 < uVar20) {
      uVar21 = uVar20;
    }
    if (uVar21 <= *(uint *)((long)piVar12 + 0x2a)) {
      uVar21 = *(uint *)((long)piVar12 + 0x2a);
    }
    if (uVar21 == 0xffffffff) {
      psVar25 = (short *)((long)piVar12 + (ulong)uVar2 + 0x2e);
      do {
        if ((uint)uVar19 < 4) goto LAB_001074e9;
        puVar1 = (ushort *)(psVar25 + 1);
        uVar15 = (ulong)*puVar1 + 4;
        if (uVar19 < uVar15) goto LAB_001074e9;
        if (*psVar25 == 1) {
          pmVar23->m_zip64 = 1;
          pmVar23->m_zip64_has_extended_info_fields = 1;
          break;
        }
        psVar25 = (short *)((long)psVar25 + uVar15);
        uVar21 = ((uint)uVar19 - 4) - (uint)*puVar1;
        uVar19 = (ulong)uVar21;
      } while (uVar21 != 0);
    }
  }
  if ((uVar5 != 0xffffffff && uVar20 != 0xffffffff) &&
     ((uVar5 != uVar20 && *(int *)((long)piVar12 + 10) == 0 || (uVar20 == 0 && uVar5 != 0)))) {
LAB_001074e9:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar4 = *(ushort *)((long)piVar12 + 0x22);
  if ((uVar4 == 0xffff) || ((uVar4 != 1 && (uVar26 != uVar4)))) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_MULTIDISK;
    return 0;
  }
  if ((uVar20 != 0xffffffff) &&
     (pZip->m_archive_size < (ulong)uVar20 + (ulong)*(uint *)((long)piVar12 + 0x2a) + 0x1e))
  goto LAB_001074e9;
  if ((*(byte *)((long)piVar12 + 9) & 0x20) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  uVar20 = (uint)uVar2 + (uint)uVar3 + (uint)*(ushort *)(piVar12 + 8) + 0x2e;
  bVar28 = uVar18 < uVar20;
  uVar18 = uVar18 - uVar20;
  if (bVar28) goto LAB_0010712a;
  piVar12 = (int *)((long)piVar12 + (ulong)uVar20);
  pmVar14 = (mz_zip_archive *)((long)&pmVar14->m_archive_size + 1);
  pZip_00 = (mz_zip_archive *)(ulong)pZip->m_total_files;
  if (pZip_00 <= pmVar14) {
LAB_001074d0:
    if ((flags >> 0xb & 1) == 0) {
      mz_zip_reader_sort_central_dir_offsets_by_filename(pZip_00);
      return 1;
    }
    return 1;
  }
  goto LAB_00107320;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip, mz_uint flags)
{
    mz_uint cdir_size = 0, cdir_entries_on_this_disk = 0, num_this_disk = 0, cdir_disk_index = 0;
    mz_uint64 cdir_ofs = 0;
    mz_int64 cur_file_ofs = 0;
    const mz_uint8 *p;

    mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
    mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
    mz_bool sort_central_dir = ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
    mz_uint32 zip64_end_of_central_dir_locator_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_locator = (mz_uint8 *)zip64_end_of_central_dir_locator_u32;

    mz_uint32 zip64_end_of_central_dir_header_u32[(MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pZip64_end_of_central_dir = (mz_uint8 *)zip64_end_of_central_dir_header_u32;

    mz_uint64 zip64_end_of_central_dir_ofs = 0;

    /* Basic sanity checks - reject files which are too small, and check the first 4 bytes of the file to make sure a local header is there. */
    if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (!mz_zip_reader_locate_header_sig(pZip, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE, &cur_file_ofs))
        return mz_zip_set_error(pZip, MZ_ZIP_FAILED_FINDING_CENTRAL_DIR);

    /* Read and verify the end of central directory record. */
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) != MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

    if (cur_file_ofs >= (MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE + MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs - MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE, pZip64_locator, MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIZE)
        {
            if (MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_LOCATOR_SIG)
            {
                zip64_end_of_central_dir_ofs = MZ_READ_LE64(pZip64_locator + MZ_ZIP64_ECDL_REL_OFS_TO_ZIP64_ECDR_OFS);
                if (zip64_end_of_central_dir_ofs > (pZip->m_archive_size - MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE))
                    return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);

                if (pZip->m_pRead(pZip->m_pIO_opaque, zip64_end_of_central_dir_ofs, pZip64_end_of_central_dir, MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE)
                {
                    if (MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIG_OFS) == MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIG)
                    {
                        pZip->m_pState->m_zip64 = MZ_TRUE;
                    }
                }
            }
        }
    }

    pZip->m_total_files = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS);
    cdir_entries_on_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
    num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
    cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
    cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS);
    cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);

    if (pZip->m_pState->m_zip64)
    {
        mz_uint32 zip64_total_num_of_disks = MZ_READ_LE32(pZip64_locator + MZ_ZIP64_ECDL_TOTAL_NUMBER_OF_DISKS_OFS);
        mz_uint64 zip64_cdir_total_entries = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_TOTAL_ENTRIES_OFS);
        mz_uint64 zip64_cdir_total_entries_on_this_disk = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS);
        mz_uint64 zip64_size_of_end_of_central_dir_record = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_SIZE_OF_RECORD_OFS);
        mz_uint64 zip64_size_of_central_directory = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_SIZE_OFS);

        if (zip64_size_of_end_of_central_dir_record < (MZ_ZIP64_END_OF_CENTRAL_DIR_HEADER_SIZE - 12))
            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

        if (zip64_total_num_of_disks != 1U)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

        /* Check for miniz's practical limits */
        if (zip64_cdir_total_entries > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        pZip->m_total_files = (mz_uint32)zip64_cdir_total_entries;

        if (zip64_cdir_total_entries_on_this_disk > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);

        cdir_entries_on_this_disk = (mz_uint32)zip64_cdir_total_entries_on_this_disk;

        /* Check for miniz's current practical limits (sorry, this should be enough for millions of files) */
        if (zip64_size_of_central_directory > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

        cdir_size = (mz_uint32)zip64_size_of_central_directory;

        num_this_disk = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_THIS_DISK_OFS);

        cdir_disk_index = MZ_READ_LE32(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_NUM_DISK_CDIR_OFS);

        cdir_ofs = MZ_READ_LE64(pZip64_end_of_central_dir + MZ_ZIP64_ECDH_CDIR_OFS_OFS);
    }

    if (pZip->m_total_files != cdir_entries_on_this_disk)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (((num_this_disk | cdir_disk_index) != 0) && ((num_this_disk != 1) || (cdir_disk_index != 1)))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

    if (cdir_size < pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    pZip->m_central_directory_file_ofs = cdir_ofs;

    if (pZip->m_total_files)
    {
        mz_uint i, n;
        /* Read the entire central directory into a heap block, and allocate another heap block to hold the unsorted central dir file record offsets, and possibly another to hold the sorted indices. */
        if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size, MZ_FALSE)) ||
            (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets, pZip->m_total_files, MZ_FALSE)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (sort_central_dir)
        {
            if (!mz_zip_array_resize(pZip, &pZip->m_pState->m_sorted_central_dir_offsets, pZip->m_total_files, MZ_FALSE))
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs, pZip->m_pState->m_central_dir.m_p, cdir_size) != cdir_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

        /* Now create an index into the central directory file records, do some basic sanity checking on each record */
        p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
        for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i)
        {
            mz_uint total_header_size, disk_index, bit_flags, filename_size, ext_data_size;
            mz_uint64 comp_size, decomp_size, local_header_ofs;

            if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) || (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, i) = (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);

            if (sort_central_dir)
                MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets, mz_uint32, i) = i;

            comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
            decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
            local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
            filename_size = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
            ext_data_size = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

            if ((!pZip->m_pState->m_zip64_has_extended_info_fields) &&
                (ext_data_size) &&
                (MZ_MAX(MZ_MAX(comp_size, decomp_size), local_header_ofs) == MZ_UINT32_MAX))
            {
                /* Attempt to find zip64 extended information field in the entry's extra data */
                mz_uint32 extra_size_remaining = ext_data_size;

                if (extra_size_remaining)
                {
                    const mz_uint8 *pExtra_data = p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size;

                    do
                    {
                        mz_uint32 field_id;
                        mz_uint32 field_data_size;

                        if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        field_id = MZ_READ_LE16(pExtra_data);
                        field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                        if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
                        {
                            /* Ok, the archive didn't have any zip64 headers but it uses a zip64 extended information field so mark it as zip64 anyway (this can occur with infozip's zip util when it reads compresses files from stdin). */
                            pZip->m_pState->m_zip64 = MZ_TRUE;
                            pZip->m_pState->m_zip64_has_extended_info_fields = MZ_TRUE;
                            break;
                        }

                        pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                        extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
                    } while (extra_size_remaining);
                }
            }

            /* I've seen archives that aren't marked as zip64 that uses zip64 ext data, argh */
            if ((comp_size != MZ_UINT32_MAX) && (decomp_size != MZ_UINT32_MAX))
            {
                if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) && (decomp_size != comp_size)) || (decomp_size && !comp_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
            if ((disk_index == MZ_UINT16_MAX) || ((disk_index != num_this_disk) && (disk_index != 1)))
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_MULTIDISK);

            if (comp_size != MZ_UINT32_MAX)
            {
                if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            bit_flags = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
            if (bit_flags & MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_LOCAL_DIR_IS_MASKED)
                return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

            if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) + MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) > n)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            n -= total_header_size;
            p += total_header_size;
        }
    }

    if (sort_central_dir)
        mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

    return MZ_TRUE;
}